

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

int __thiscall QFileDialog::open(QFileDialog *this,char *__file,int __oflag,...)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  undefined8 uVar4;
  int __oflag_00;
  char *pcVar5;
  QFileDialogPrivate *d;
  long in_FS_OFFSET;
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  iVar3 = QFileDialogOptions::fileMode();
  pcVar5 = "2fileSelected(QString)";
  if (iVar3 == 3) {
    pcVar5 = "2filesSelected(QStringList)";
  }
  uVar4 = 0;
  QObject::connect((QObject *)&local_40,(char *)this,(QObject *)pcVar5,__file,
                   (ConnectionType)___oflag);
  QMetaObject::Connection::~Connection(&local_40);
  QByteArray::operator=((QByteArray *)(lVar1 + 0x3b8),pcVar5);
  if (__file != (char *)0x0) {
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)__file);
  }
  piVar2 = *(int **)(lVar1 + 0x390);
  *(undefined8 *)(lVar1 + 0x390) = uVar4;
  *(char **)(lVar1 + 0x398) = __file;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  QByteArray::operator=((QByteArray *)(lVar1 + 0x3a0),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::open(QObject *receiver, const char *member)
{
    Q_D(QFileDialog);
    const char *signal = (fileMode() == ExistingFiles) ? SIGNAL(filesSelected(QStringList))
                                                       : SIGNAL(fileSelected(QString));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;

    QDialog::open();
}